

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Namespace *n)

{
  bool bVar1;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *this_00;
  VariableDeclaration *pVVar2;
  CompileMessage local_80;
  reference local_48;
  pool_ref<soul::AST::VariableDeclaration> *v;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2;
  Namespace *local_18;
  Namespace *n_local;
  PostResolutionChecks *this_local;
  
  local_18 = n;
  n_local = (Namespace *)this;
  ASTVisitor::visit(&this->super_ASTVisitor,n);
  ArrayView<soul::pool_ref<soul::AST::Function>>::
  ArrayView<std::vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>>
            ((ArrayView<soul::pool_ref<soul::AST::Function>> *)&__range2,&local_18->functions);
  checkForDuplicateFunctions(___range2);
  this_00 = &local_18->constants;
  __end2 = std::
           vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ::begin(this_00);
  v = (pool_ref<soul::AST::VariableDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                                *)&v);
    if (!bVar1) {
      return;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
               ::operator*(&__end2);
    pVVar2 = pool_ref<soul::AST::VariableDeclaration>::operator->(local_48);
    bVar1 = AST::VariableDeclaration::isCompileTimeConstant(pVVar2);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  pVVar2 = pool_ref<soul::AST::VariableDeclaration>::operator->(local_48);
  Errors::nonConstInNamespace<>();
  AST::Context::throwError(&(pVVar2->super_Statement).super_ASTObject.context,&local_80,false);
}

Assistant:

void visit (AST::Namespace& n) override
        {
            super::visit (n);
            checkForDuplicateFunctions (n.functions);

            for (auto& v : n.constants)
                if (! v->isCompileTimeConstant())
                    v->context.throwError (Errors::nonConstInNamespace());
        }